

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

ssize_t __thiscall smf::MidiFile::read(MidiFile *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  ulong uVar2;
  void *__buf_00;
  ulong uVar3;
  undefined4 in_register_00000034;
  fstream input;
  char local_230 [528];
  
  this->m_timemapvalid = false;
  setFilename(this,(string *)CONCAT44(in_register_00000034,__fd));
  this->m_rwstatus = true;
  std::fstream::fstream(local_230);
  std::fstream::open(local_230,
                     (_Ios_Openmode)
                     (((string *)CONCAT44(in_register_00000034,__fd))->_M_dataplus)._M_p);
  uVar1 = std::__basic_file<char>::is_open();
  uVar2 = 0;
  uVar3 = 0;
  if ((char)uVar1 != '\0') {
    uVar2 = read(this,(int)local_230,__buf_00,(ulong)uVar1);
    uVar3 = uVar2 & 0xffffffff;
  }
  this->m_rwstatus = SUB81(uVar2,0);
  std::fstream::~fstream(local_230);
  return uVar3;
}

Assistant:

bool MidiFile::read(const std::string& filename) {
	m_timemapvalid = 0;
	setFilename(filename);
	m_rwstatus = true;

	std::fstream input;
	input.open(filename.c_str(), std::ios::binary | std::ios::in);

	if (!input.is_open()) {
		m_rwstatus = false;
		return m_rwstatus;
	}

	m_rwstatus = read(input);
	return m_rwstatus;
}